

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O0

void __thiscall Lowerer::GenerateFastInlineRegExpExec(Lowerer *this,Instr *instr)

{
  code *pcVar1;
  bool bVar2;
  ProgramTag PVar3;
  ValueType valueType;
  uint uVar4;
  uint functionId;
  BailOutKind BVar5;
  undefined4 *puVar6;
  Opnd *dst;
  Opnd *pOVar7;
  SymOpnd *pSVar8;
  StackSym *pSVar9;
  RegOpnd *pRVar10;
  RegOpnd *pRVar11;
  IndirOpnd *pIVar12;
  LabelInstr *target;
  RegOpnd *pRVar13;
  LabelInstr *target_00;
  size_t sVar14;
  IntConstOpnd *pIVar15;
  LabelInstr *target_01;
  RegOpnd *pRVar16;
  LabelInstr *target_02;
  HelperCallOpnd *src1Opnd;
  Instr *instr_00;
  size_t sVar17;
  AddrOpnd *src;
  BailOutInfo *bailoutInfo;
  bool local_f9;
  RegOpnd *stackAllocationOpnd;
  AutoReuseOpnd autoReuseStackAllocationOpnd;
  Instr *pIStack_b8;
  JnHelperMethod helperMethod;
  Instr *helperCallInstr;
  RegOpnd *opndBufferDWORD;
  Instr *instrCall;
  LabelInstr *labelGotString;
  RegOpnd *opndBuffer;
  LabelInstr *labelNoMatch;
  LabelInstr *labelFastHelper;
  RegOpnd *opndProgram;
  RegOpnd *opndPattern;
  LabelInstr *doneLabel;
  Opnd *vtableOpnd;
  Opnd *opndRegex;
  LabelInstr *local_50;
  LabelInstr *labelHelper;
  RegOpnd *local_40;
  Opnd *opndString;
  Opnd *argsOpnd [2];
  Instr *tmpInstr;
  Opnd *callDst;
  Instr *instr_local;
  Lowerer *this_local;
  
  if (instr->m_opcode != CallDirect) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x50a8,"(instr->m_opcode == Js::OpCode::CallDirect)",
                       "instr->m_opcode == Js::OpCode::CallDirect");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  dst = IR::Instr::GetDst(instr);
  pOVar7 = IR::Instr::GetSrc2(instr);
  pSVar8 = IR::Opnd::AsSymOpnd(pOVar7);
  pSVar9 = Sym::AsStackSym(pSVar8->m_sym);
  argsOpnd[1] = (Opnd *)(pSVar9->field_5).m_instrDef;
  bVar2 = IR::Instr::FetchOperands(instr,&opndString,2);
  if (bVar2) {
    local_40 = (RegOpnd *)argsOpnd[0];
    labelHelper._6_2_ =
         (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
         IR::Opnd::GetValueType(argsOpnd[0]);
    bVar2 = ValueType::IsLikelyString((ValueType *)((long)&labelHelper + 6));
    local_f9 = true;
    if (bVar2) {
      local_f9 = IR::Opnd::IsTaggedInt(opndString);
    }
    if (local_f9 == false) {
      local_50 = IR::LabelInstr::New(Label,this->m_func,true);
      opndRegex._6_2_ =
           (anon_struct_2_1_ebef698d_for_anon_union_2_4_ea848c7b_for_ValueType_13_0)
           IR::Opnd::GetValueType(&local_40->super_Opnd);
      bVar2 = ValueType::IsString((ValueType *)((long)&opndRegex + 6));
      if (((bVar2 ^ 0xffU) & 1) != 0) {
        local_40 = GetRegOpnd(this,&local_40->super_Opnd,instr,this->m_func,TyVar);
        pRVar10 = IR::Opnd::AsRegOpnd(&local_40->super_Opnd);
        GenerateStringTest(this,pRVar10,instr,local_50,(LabelInstr *)0x0,true);
      }
      bVar2 = IR::Opnd::IsNotTaggedValue(opndString);
      if (!bVar2) {
        LowererMD::GenerateObjectTest(&this->m_lowererMD,opndString,instr,local_50,false);
      }
      pOVar7 = LoadVTableValueOpnd(this,instr,VtableJavascriptRegExp);
      pRVar10 = GetRegOpnd(this,opndString,instr,this->m_func,TyVar);
      pRVar11 = IR::Opnd::AsRegOpnd(&pRVar10->super_Opnd);
      pIVar12 = IR::IndirOpnd::New(pRVar11,0,TyUint64,instr->m_func,false);
      InsertCompareBranch(this,&pIVar12->super_Opnd,pOVar7,BrNeq_A,local_50,instr,false);
      target = IR::LabelInstr::New(Label,this->m_func,false);
      uVar4 = Func::GetSourceContextId(this->m_func);
      functionId = Func::GetLocalFunctionId(this->m_func);
      bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_01eafdf0,ExecBOIFastPathPhase,uVar4,functionId);
      if (!bVar2) {
        pRVar11 = IR::RegOpnd::New(TyUint64,this->m_func);
        pRVar13 = IR::Opnd::AsRegOpnd(&pRVar10->super_Opnd);
        uVar4 = Js::JavascriptRegExp::GetOffsetOfPattern();
        pIVar12 = IR::IndirOpnd::New(pRVar13,uVar4,TyUint64,this->m_func,false);
        InsertMove(&pRVar11->super_Opnd,&pIVar12->super_Opnd,instr,true);
        pRVar13 = IR::RegOpnd::New(TyUint64,this->m_func);
        pIVar12 = IR::IndirOpnd::New(pRVar11,0x20,TyUint64,this->m_func,false);
        InsertMove(&pRVar13->super_Opnd,&pIVar12->super_Opnd,instr,true);
        target_00 = IR::LabelInstr::New(Label,this->m_func,false);
        sVar14 = UnifiedRegex::Program::GetOffsetOfTag();
        pIVar12 = IR::IndirOpnd::New(pRVar13,(int32)sVar14,TyUint8,this->m_func,false);
        PVar3 = UnifiedRegex::Program::GetBOILiteral2Tag();
        pIVar15 = IR::IntConstOpnd::New((ulong)PVar3,TyUint8,this->m_func,false);
        InsertCompareBranch(this,&pIVar12->super_Opnd,&pIVar15->super_Opnd,BrNeq_A,target_00,instr,
                            false);
        pIVar12 = IR::IndirOpnd::New(pRVar13,0x14,TyUint8,this->m_func,false);
        pIVar15 = IR::IntConstOpnd::New(2,TyUint8,this->m_func,false);
        InsertTestBranch(&pIVar12->super_Opnd,&pIVar15->super_Opnd,BrNeq_A,target_00,instr);
        target_01 = IR::LabelInstr::New(Label,this->m_func,false);
        pRVar11 = IR::Opnd::AsRegOpnd(&local_40->super_Opnd);
        pIVar12 = IR::IndirOpnd::New(pRVar11,0x18,TyUint32,this->m_func,false);
        pIVar15 = IR::IntConstOpnd::New(2,TyUint32,this->m_func,false);
        InsertCompareBranch(this,&pIVar12->super_Opnd,&pIVar15->super_Opnd,BrLt_A,target_01,instr,
                            false);
        pRVar11 = IR::RegOpnd::New(TyInt64,this->m_func);
        pRVar16 = IR::Opnd::AsRegOpnd(&local_40->super_Opnd);
        pIVar12 = IR::IndirOpnd::New(pRVar16,0x10,TyUint64,this->m_func,false);
        InsertMove(&pRVar11->super_Opnd,&pIVar12->super_Opnd,instr,true);
        target_02 = IR::LabelInstr::New(Label,this->m_func,false);
        InsertTestBranch(&pRVar11->super_Opnd,&pRVar11->super_Opnd,BrNeq_A,target_02,instr);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,instr,&local_40->super_Opnd);
        src1Opnd = IR::HelperCallOpnd::New(HelperString_GetSz,this->m_func);
        instr_00 = IR::Instr::New(Call,&pRVar11->super_Opnd,&src1Opnd->super_Opnd,this->m_func);
        IR::Instr::InsertBefore(instr,instr_00);
        LowererMD::LowerCall(&this->m_lowererMD,instr_00,0);
        IR::Instr::InsertBefore(instr,&target_02->super_Instr);
        pRVar16 = IR::RegOpnd::New(TyUint32,this->m_func);
        pIVar12 = IR::IndirOpnd::New(pRVar11,0,TyUint32,this->m_func,false);
        InsertMove(&pRVar16->super_Opnd,&pIVar12->super_Opnd,instr,true);
        sVar14 = UnifiedRegex::Program::GetOffsetOfRep();
        sVar17 = UnifiedRegex::Program::GetOffsetOfBOILiteral2Literal();
        pIVar12 = IR::IndirOpnd::New(pRVar13,(int)sVar14 + (int)sVar17,TyUint32,this->m_func,false);
        InsertCompareBranch(this,&pIVar12->super_Opnd,&pRVar16->super_Opnd,BrEq_A,target_00,instr,
                            false);
        IR::Instr::InsertBefore(instr,&target_01->super_Instr);
        pRVar11 = IR::Opnd::AsRegOpnd(&pRVar10->super_Opnd);
        uVar4 = Js::JavascriptRegExp::GetOffsetOfLastIndexVar();
        pIVar12 = IR::IndirOpnd::New(pRVar11,uVar4,TyVar,this->m_func,false);
        src = IR::AddrOpnd::NewNull(this->m_func);
        InsertMove(&pIVar12->super_Opnd,&src->super_Opnd,instr,true);
        pRVar11 = IR::Opnd::AsRegOpnd(&pRVar10->super_Opnd);
        uVar4 = Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag();
        pIVar12 = IR::IndirOpnd::New(pRVar11,uVar4,TyUint32,this->m_func,false);
        pIVar15 = IR::IntConstOpnd::New(0,TyUint32,this->m_func,false);
        InsertMove(&pIVar12->super_Opnd,&pIVar15->super_Opnd,instr,true);
        if (dst != (Opnd *)0x0) {
          pOVar7 = LoadLibraryValueOpnd(this,instr,ValueNull);
          InsertMove(dst,pOVar7,instr,true);
        }
        InsertBranch(Br,target,instr);
        IR::Instr::InsertBefore(instr,&target_00->super_Instr);
      }
      pIStack_b8 = IR::Instr::New(CALL,instr->m_func);
      if (dst != (Opnd *)0x0) {
        IR::Instr::SetDst(pIStack_b8,dst);
      }
      IR::Instr::InsertBefore(instr,pIStack_b8);
      bVar2 = IR::Instr::HasBailOutInfo(instr);
      if (bVar2) {
        BVar5 = IR::Instr::GetBailOutKind(instr);
        bVar2 = BailOutInfo::IsBailOutOnImplicitCalls(BVar5);
        if (bVar2) {
          bailoutInfo = IR::Instr::GetBailOutInfo(instr);
          BVar5 = IR::Instr::GetBailOutKind(instr);
          pIStack_b8 = AddBailoutToHelperCallInstr(this,pIStack_b8,bailoutInfo,BVar5,instr);
        }
      }
      LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_b8,&local_40->super_Opnd);
      LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_b8,&pRVar10->super_Opnd);
      LoadScriptContext(this,pIStack_b8);
      IR::AutoReuseOpnd::AutoReuseOpnd((AutoReuseOpnd *)&stackAllocationOpnd);
      if (dst == (Opnd *)0x0) {
        autoReuseStackAllocationOpnd._20_4_ = 0x1c6;
      }
      else if ((*(ushort *)&instr->field_0x36 >> 3 & 1) == 0) {
        autoReuseStackAllocationOpnd._20_4_ = 0x1c4;
      }
      else {
        autoReuseStackAllocationOpnd._20_4_ = 0x1c5;
        pRVar10 = IR::RegOpnd::New(TyVar,this->m_func);
        IR::AutoReuseOpnd::Initialize
                  ((AutoReuseOpnd *)&stackAllocationOpnd,&pRVar10->super_Opnd,this->m_func,true);
        valueType = IR::Opnd::GetValueType(dst);
        IR::Opnd::SetValueType(&pRVar10->super_Opnd,valueType);
        GenerateMarkTempAlloc(this,pRVar10,Js::JavascriptArray::StackAllocationSize,pIStack_b8);
        LowererMD::LoadHelperArgument(&this->m_lowererMD,pIStack_b8,&pRVar10->super_Opnd);
      }
      LowererMD::ChangeToHelperCall
                (&this->m_lowererMD,pIStack_b8,autoReuseStackAllocationOpnd._20_4_,(LabelInstr *)0x0
                 ,(Opnd *)0x0,(PropertySymOpnd *)0x0,false);
      IR::Instr::InsertAfter(instr,&target->super_Instr);
      IR::Instr::InsertBefore(instr,&local_50->super_Instr);
      InsertBranch(Br,true,target,&local_50->super_Instr);
      RelocateCallDirectToHelperPath(this,(Instr *)argsOpnd[1],local_50);
      IR::AutoReuseOpnd::~AutoReuseOpnd((AutoReuseOpnd *)&stackAllocationOpnd);
    }
  }
  return;
}

Assistant:

void
Lowerer::GenerateFastInlineRegExpExec(IR::Instr * instr)
{
    // a.exec(b)
    // We want to emit the fast path when 'a' is a regex and 'b' is a string

    Assert(instr->m_opcode == Js::OpCode::CallDirect);
    IR::Opnd * callDst = instr->GetDst();

    //ArgOut_A_InlineSpecialized
    IR::Instr * tmpInstr = instr->GetSrc2()->AsSymOpnd()->m_sym->AsStackSym()->m_instrDef;

    IR::Opnd * argsOpnd[2];
    if (!instr->FetchOperands(argsOpnd, 2))
    {
        return;
    }

    IR::Opnd *opndString = argsOpnd[1];
    if(!opndString->GetValueType().IsLikelyString() || argsOpnd[0]->IsTaggedInt())
    {
        return;
    }

    IR::LabelInstr *labelHelper = IR::LabelInstr::New(Js::OpCode::Label, this->m_func, true);
    if(!opndString->GetValueType().IsString())
    {
        opndString = GetRegOpnd(opndString, instr, m_func, TyVar);
        this->GenerateStringTest(opndString->AsRegOpnd(), instr, labelHelper);
    }

    IR::Opnd *opndRegex = argsOpnd[0];
    if(!opndRegex->IsNotTaggedValue())
    {
        m_lowererMD.GenerateObjectTest(opndRegex, instr, labelHelper);
    }

    IR::Opnd * vtableOpnd = LoadVTableValueOpnd(instr, VTableValue::VtableJavascriptRegExp);

    // cmp  [regex], vtableAddress
    // jne  $labelHelper
    opndRegex = GetRegOpnd(opndRegex, instr, m_func, TyVar);
    InsertCompareBranch(
        IR::IndirOpnd::New(opndRegex->AsRegOpnd(), 0, TyMachPtr, instr->m_func),
        vtableOpnd,
        Js::OpCode::BrNeq_A,
        labelHelper,
        instr);

    IR::LabelInstr *doneLabel = IR::LabelInstr::New(Js::OpCode::Label, m_func);

    if (!PHASE_OFF(Js::ExecBOIFastPathPhase, m_func))
    {
        // Load pattern from regex operand
        IR::RegOpnd *opndPattern = IR::RegOpnd::New(TyMachPtr, m_func);
        Lowerer::InsertMove(
            opndPattern,
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfPattern(), TyMachPtr, m_func),
            instr);

        // Load program from pattern
        IR::RegOpnd *opndProgram = IR::RegOpnd::New(TyMachPtr, m_func);
        Lowerer::InsertMove(
            opndProgram,
            IR::IndirOpnd::New(opndPattern, offsetof(UnifiedRegex::RegexPattern, rep) + offsetof(UnifiedRegex::RegexPattern::UnifiedRep, program), TyMachPtr, m_func),
            instr);

        IR::LabelInstr *labelFastHelper = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        // We want the program's tag to be BOILiteral2Tag
        InsertCompareBranch(
            IR::IndirOpnd::New(opndProgram, (int32)UnifiedRegex::Program::GetOffsetOfTag(), TyUint8, m_func),
            IR::IntConstOpnd::New((IntConstType)UnifiedRegex::Program::GetBOILiteral2Tag(), TyUint8, m_func),
            Js::OpCode::BrNeq_A,
            labelFastHelper,
            instr);

        // Test the program's flags for "global"
        InsertTestBranch(
            IR::IndirOpnd::New(opndProgram, offsetof(UnifiedRegex::Program, flags), TyUint8, m_func),
            IR::IntConstOpnd::New(UnifiedRegex::GlobalRegexFlag, TyUint8, m_func),
            Js::OpCode::BrNeq_A,
            labelFastHelper,
            instr);

        IR::LabelInstr *labelNoMatch = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        // If string length < 2...
        InsertCompareBranch(
            IR::IndirOpnd::New(opndString->AsRegOpnd(), offsetof(Js::JavascriptString, m_charLength), TyUint32, m_func),
            IR::IntConstOpnd::New(2, TyUint32, m_func),
            Js::OpCode::BrLt_A,
            labelNoMatch,
            instr);

        // ...or the DWORD doesn't match the pattern...
        IR::RegOpnd *opndBuffer = IR::RegOpnd::New(TyMachReg, m_func);
        Lowerer::InsertMove(
            opndBuffer,
            IR::IndirOpnd::New(opndString->AsRegOpnd(), offsetof(Js::JavascriptString, m_pszValue), TyMachPtr, m_func),
            instr);

        IR::LabelInstr *labelGotString = IR::LabelInstr::New(Js::OpCode::Label, m_func);

        InsertTestBranch(opndBuffer, opndBuffer, Js::OpCode::BrNeq_A, labelGotString, instr);

        m_lowererMD.LoadHelperArgument(instr, opndString);
        IR::Instr *instrCall = IR::Instr::New(Js::OpCode::Call, opndBuffer, IR::HelperCallOpnd::New(IR::HelperString_GetSz, m_func), m_func);
        instr->InsertBefore(instrCall);
        m_lowererMD.LowerCall(instrCall, 0);

        instr->InsertBefore(labelGotString);

        IR::RegOpnd *opndBufferDWORD = IR::RegOpnd::New(TyUint32, m_func);
        Lowerer::InsertMove(
            opndBufferDWORD,
            IR::IndirOpnd::New(opndBuffer, 0, TyUint32, m_func),
            instr);

        InsertCompareBranch(
            IR::IndirOpnd::New(opndProgram, (int32)(UnifiedRegex::Program::GetOffsetOfRep() + UnifiedRegex::Program::GetOffsetOfBOILiteral2Literal()), TyUint32, m_func),
            opndBufferDWORD,
            Js::OpCode::BrEq_A,
            labelFastHelper,
            instr);

        // ...then set the last index to 0...
        instr->InsertBefore(labelNoMatch);

        Lowerer::InsertMove(
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfLastIndexVar(), TyVar, m_func),
            IR::AddrOpnd::NewNull(m_func),
            instr);

        Lowerer::InsertMove(
            IR::IndirOpnd::New(opndRegex->AsRegOpnd(), Js::JavascriptRegExp::GetOffsetOfLastIndexOrFlag(), TyUint32, m_func),
            IR::IntConstOpnd::New(0, TyUint32, m_func),
            instr);

        // ...and set the dst to null...
        if (callDst)
        {
            Lowerer::InsertMove(
                callDst,
                LoadLibraryValueOpnd(instr, LibraryValue::ValueNull),
                instr);
        }

        // ...and we're done.
        this->InsertBranch(Js::OpCode::Br, doneLabel, instr);

        instr->InsertBefore(labelFastHelper);
    }

    IR::Instr * helperCallInstr = IR::Instr::New(LowererMD::MDCallOpcode, instr->m_func);
    if (callDst)
    {
        helperCallInstr->SetDst(callDst);
    }
    instr->InsertBefore(helperCallInstr);
    if (instr->HasBailOutInfo() && BailOutInfo::IsBailOutOnImplicitCalls(instr->GetBailOutKind()))
    {
        helperCallInstr = AddBailoutToHelperCallInstr(helperCallInstr, instr->GetBailOutInfo(), instr->GetBailOutKind(), instr);
    }
    // [stackAllocationPointer, ]scriptcontext, regexp, string (to be pushed in reverse order)

    //string, regexp
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, opndString);
    this->m_lowererMD.LoadHelperArgument(helperCallInstr, opndRegex);

    // script context
    LoadScriptContext(helperCallInstr);

    IR::JnHelperMethod helperMethod;
    IR::AutoReuseOpnd autoReuseStackAllocationOpnd;
    if (callDst)
    {
        if (instr->dstIsTempObject)
        {
            helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultUsedAndMayBeTemp;

            // Allocate some space on the stack for the result array
            IR::RegOpnd *const stackAllocationOpnd = IR::RegOpnd::New(TyVar, m_func);
            autoReuseStackAllocationOpnd.Initialize(stackAllocationOpnd, m_func);
            stackAllocationOpnd->SetValueType(callDst->GetValueType());
            GenerateMarkTempAlloc(stackAllocationOpnd, Js::JavascriptArray::StackAllocationSize, helperCallInstr);
            m_lowererMD.LoadHelperArgument(helperCallInstr, stackAllocationOpnd);
        }
        else
        {
            helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultUsed;
        }
    }
    else
    {
        helperMethod = IR::JnHelperMethod::HelperRegExp_ExecResultNotUsed;
    }

    m_lowererMD.ChangeToHelperCall(helperCallInstr, helperMethod);

    instr->InsertAfter(doneLabel);
    instr->InsertBefore(labelHelper);
    InsertBranch(Js::OpCode::Br, true, doneLabel, labelHelper);

    RelocateCallDirectToHelperPath(tmpInstr, labelHelper);
}